

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

void Imf_3_4::anon_unknown_1::clearCompressionRecord(Header *hdr)

{
  pthread_mutex_t *__mutex;
  iterator __position;
  lock_guard<std::mutex> lk;
  Header *local_20;
  
  __mutex = (pthread_mutex_t *)getStash();
  if (__mutex != (pthread_mutex_t *)0x0) {
    std::mutex::lock((mutex *)&__mutex->__data);
    local_20 = hdr;
    __position = std::
                 map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
                 ::find((map<const_void_*,_Imf_3_4::(anonymous_namespace)::CompressionRecord,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_Imf_3_4::(anonymous_namespace)::CompressionRecord>_>_>
                         *)&__mutex[1].__data,&local_20);
    if (__position._M_node != (_Base_ptr)((long)__mutex + 0x30)) {
      std::
      map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
      ::erase_abi_cxx11_((map<void_const*,Imf_3_4::(anonymous_namespace)::CompressionRecord,std::less<void_const*>,std::allocator<std::pair<void_const*const,Imf_3_4::(anonymous_namespace)::CompressionRecord>>>
                          *)&__mutex[1].__data,__position);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  return;
}

Assistant:

static void
clearCompressionRecord (Header* hdr)
{
    CompressionStash* s = getStash ();
    if (s)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lk (s->_mutex);
#endif
        auto i = s->_store.find (hdr);
        if (i != s->_store.end ()) s->_store.erase (i);
    }
}